

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_coarsen_qualities.cpp
# Opt level: O0

Reals __thiscall
Omega_h::coarsen_qualities_tmpl<3,3>
          (Omega_h *this,Mesh *mesh,LOs *cands2edges,Read<signed_char> *cand_codes)

{
  int size_in;
  Int IVar1;
  LO size_in_00;
  void *extraout_RDX;
  Reals RVar2;
  Read<int> local_260;
  Read<double> local_250;
  Write<double> local_240;
  undefined1 local_230 [8];
  Reals out;
  type f;
  string local_178 [32];
  undefined1 local_158 [8];
  Write<signed_char> is_bad_w;
  Reals coords;
  string local_130 [32];
  undefined1 local_110 [8];
  Write<double> qualities;
  undefined1 local_f8 [4];
  LO ncands;
  Read<signed_char> vc_codes;
  LOs vc2c;
  LOs v2vc;
  Adj v2c;
  LOs cv2v;
  undefined1 local_78 [8];
  LOs ev2v;
  MetricElementQualities<3,_3> measure;
  Read<signed_char> *cand_codes_local;
  LOs *cands2edges_local;
  Mesh *mesh_local;
  pointer local_10;
  
  IVar1 = Mesh::dim(mesh);
  if (IVar1 == 3) {
    MetricElementQualities<3,_3>::MetricElementQualities
              ((MetricElementQualities<3,_3> *)&ev2v.write_.shared_alloc_.direct_ptr,mesh);
    Mesh::ask_verts_of((Mesh *)local_78,(Int)mesh);
    Mesh::ask_elem_verts((Mesh *)&v2c.codes.write_.shared_alloc_.direct_ptr);
    Mesh::ask_up((Adj *)&v2vc.write_.shared_alloc_.direct_ptr,mesh,0,3);
    Read<int>::Read((Read<int> *)&vc2c.write_.shared_alloc_.direct_ptr,
                    (Read<int> *)&v2vc.write_.shared_alloc_.direct_ptr);
    Read<int>::Read((Read<int> *)&vc_codes.write_.shared_alloc_.direct_ptr,
                    (Read<int> *)&v2c.super_Graph.a2ab.write_.shared_alloc_.direct_ptr);
    Read<signed_char>::Read
              ((Read<signed_char> *)local_f8,
               (Read<signed_char> *)&v2c.super_Graph.ab2b.write_.shared_alloc_.direct_ptr);
    if (((ulong)(cands2edges->write_).shared_alloc_.alloc & 1) == 0) {
      local_10 = (pointer)((cands2edges->write_).shared_alloc_.alloc)->size;
    }
    else {
      local_10 = (pointer)((ulong)(cands2edges->write_).shared_alloc_.alloc >> 3);
    }
    qualities.shared_alloc_.direct_ptr._4_4_ = (int)((ulong)local_10 >> 2);
    size_in = qualities.shared_alloc_.direct_ptr._4_4_ * 2;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_130,"",(allocator *)((long)&coords.write_.shared_alloc_.direct_ptr + 7));
    Write<double>::Write((Write<double> *)local_110,size_in,-1.0,(string *)local_130);
    std::__cxx11::string::~string(local_130);
    std::allocator<char>::~allocator
              ((allocator<char> *)((long)&coords.write_.shared_alloc_.direct_ptr + 7));
    Mesh::coords((Mesh *)&is_bad_w.shared_alloc_.direct_ptr);
    size_in_00 = Mesh::nelems(mesh);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_178,"",(allocator *)((long)&f.qualities.shared_alloc_.direct_ptr + 7));
    Write<signed_char>::Write((Write<signed_char> *)local_158,size_in_00,'\0',(string *)local_178);
    std::__cxx11::string::~string(local_178);
    std::allocator<char>::~allocator
              ((allocator<char> *)((long)&f.qualities.shared_alloc_.direct_ptr + 7));
    Read<int>::Read((Read<int> *)&out.write_.shared_alloc_.direct_ptr,cands2edges);
    Read<signed_char>::Read
              ((Read<signed_char> *)&f.cands2edges.write_.shared_alloc_.direct_ptr,cand_codes);
    Read<int>::Read((Read<int> *)&f.cand_codes.write_.shared_alloc_.direct_ptr,(Read<int> *)local_78
                   );
    Read<int>::Read((Read<int> *)&f.ev2v.write_.shared_alloc_.direct_ptr,
                    (Read<int> *)&vc2c.write_.shared_alloc_.direct_ptr);
    Read<int>::Read((Read<int> *)&f.v2vc.write_.shared_alloc_.direct_ptr,
                    (Read<int> *)&vc_codes.write_.shared_alloc_.direct_ptr);
    Read<signed_char>::Read
              ((Read<signed_char> *)&f.vc2c.write_.shared_alloc_.direct_ptr,
               (Read<signed_char> *)local_f8);
    Read<int>::Read((Read<int> *)&f.vc_codes.write_.shared_alloc_.direct_ptr,
                    (Read<int> *)&v2c.codes.write_.shared_alloc_.direct_ptr);
    MetricElementQualities<3,_3>::MetricElementQualities
              ((MetricElementQualities<3,_3> *)&f.cv2v.write_.shared_alloc_.direct_ptr,
               (MetricElementQualities<3,_3> *)&ev2v.write_.shared_alloc_.direct_ptr);
    Write<double>::Write
              ((Write<double> *)&f.measure.metrics.write_.shared_alloc_.direct_ptr,
               (Write<double> *)local_110);
    parallel_for<Omega_h::coarsen_qualities_tmpl<3,3>(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<signed_char>)::_lambda(int)_1_>
              (qualities.shared_alloc_.direct_ptr._4_4_,(type *)&out.write_.shared_alloc_.direct_ptr
               ,"coarsen_qualities");
    Write<double>::Write(&local_240,(Write<double> *)local_110);
    Read<double>::Read((Read<double> *)local_230,&local_240);
    Write<double>::~Write(&local_240);
    Read<double>::Read(&local_250,(Read<double> *)local_230);
    Read<int>::Read(&local_260,cands2edges);
    Mesh::sync_subset_array<double>
              ((Mesh *)this,(Int)mesh,(Read<double> *)0x1,(LOs *)&local_250,-1.0,(Int)&local_260);
    Read<int>::~Read(&local_260);
    Read<double>::~Read(&local_250);
    Read<double>::~Read((Read<double> *)local_230);
    coarsen_qualities_tmpl<3,3>(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<signed_char>)::
    {lambda(int)#1}::~Mesh((_lambda_int__1_ *)&out.write_.shared_alloc_.direct_ptr);
    Write<signed_char>::~Write((Write<signed_char> *)local_158);
    Read<double>::~Read((Read<double> *)&is_bad_w.shared_alloc_.direct_ptr);
    Write<double>::~Write((Write<double> *)local_110);
    Read<signed_char>::~Read((Read<signed_char> *)local_f8);
    Read<int>::~Read((Read<int> *)&vc_codes.write_.shared_alloc_.direct_ptr);
    Read<int>::~Read((Read<int> *)&vc2c.write_.shared_alloc_.direct_ptr);
    Adj::~Adj((Adj *)&v2vc.write_.shared_alloc_.direct_ptr);
    Read<int>::~Read((Read<int> *)&v2c.codes.write_.shared_alloc_.direct_ptr);
    Read<int>::~Read((Read<int> *)local_78);
    MetricElementQualities<3,_3>::~MetricElementQualities
              ((MetricElementQualities<3,_3> *)&ev2v.write_.shared_alloc_.direct_ptr);
    RVar2.write_.shared_alloc_.direct_ptr = extraout_RDX;
    RVar2.write_.shared_alloc_.alloc = (Alloc *)this;
    return (Reals)RVar2.write_.shared_alloc_;
  }
  fail("assertion %s failed at %s +%d\n","mesh->dim() == mesh_dim",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_coarsen_qualities.cpp"
       ,0x12);
}

Assistant:

Reals coarsen_qualities_tmpl(
    Mesh* mesh, LOs cands2edges, Read<I8> cand_codes) {
  OMEGA_H_CHECK(mesh->dim() == mesh_dim);
  MetricElementQualities<mesh_dim, metric_dim> measure(mesh);
  auto ev2v = mesh->ask_verts_of(EDGE);
  auto cv2v = mesh->ask_elem_verts();
  auto v2c = mesh->ask_up(VERT, mesh_dim);
  auto v2vc = v2c.a2ab;
  auto vc2c = v2c.ab2b;
  auto vc_codes = v2c.codes;
  auto ncands = cands2edges.size();
  auto qualities = Write<Real>(ncands * 2, -1.0);
  auto coords = mesh->coords();
  auto is_bad_w = Write<Byte>(mesh->nelems(), Byte(0));
  auto f = OMEGA_H_LAMBDA(LO cand) {
    auto e = cands2edges[cand];
    auto code = cand_codes[cand];
    for (Int eev_col = 0; eev_col < 2; ++eev_col) {
      if (!collapses(code, eev_col)) continue;
      auto v_col = ev2v[e * 2 + eev_col];
      auto eev_onto = 1 - eev_col;
      auto v_onto = ev2v[e * 2 + eev_onto];
      Real minqual = 1.0;
      for (auto vc = v2vc[v_col]; vc < v2vc[v_col + 1]; ++vc) {
        auto c = vc2c[vc];
        auto vc_code = vc_codes[vc];
        auto ccv_col = code_which_down(vc_code);
        auto ccv2v = gather_verts<mesh_dim + 1>(cv2v, c);
        bool will_die = false;
        for (auto ccv = 0; ccv < (mesh_dim + 1); ++ccv) {
          if ((ccv != ccv_col) && (ccv2v[ccv] == v_onto)) {
            will_die = true;
            break;
          }
        }
        if (will_die) continue;
        OMEGA_H_CHECK(0 <= ccv_col && ccv_col < mesh_dim + 1);
        ccv2v[ccv_col] = v_onto;  // vertices of new cell
        auto qual = measure.measure(ccv2v);
        minqual = min2(minqual, qual);
      }
      qualities[cand * 2 + eev_col] = minqual;
    }
  };
  parallel_for(ncands, f, "coarsen_qualities");
  auto out = Reals(qualities);
  return mesh->sync_subset_array(EDGE, out, cands2edges, -1.0, 2);
}